

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O1

wasm_instance_t *
wasm_instance_new(wasm_store_t *store,wasm_module_t *module,wasm_extern_t **imports,
                 wasm_trap_t **trap_out)

{
  Trap *pTVar1;
  wasm_trap_t *this;
  Object *pOVar2;
  ulong uVar3;
  RefPtr<wabt::interp::Instance> *ptr;
  Ptr trap;
  Ptr instance;
  RefVec import_refs;
  RefPtr<wabt::interp::Instance> local_60;
  RefPtr<wabt::interp::Instance> local_48;
  
  fprintf(_stderr,"CAPI: [%s] %p %p\n","wasm_instance_new",store,module);
  if (module == (wasm_module_t *)0x0) {
    __assert_fail("module",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/interp/interp-wasm-c-api.cc"
                  ,0x2de,
                  "wasm_instance_t *wasm_instance_new(wasm_store_t *, const wasm_module_t *, const wasm_extern_t *const *, wasm_trap_t **)"
                 );
  }
  if (store != (wasm_store_t *)0x0) {
    import_refs.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    import_refs.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    import_refs.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pOVar2 = (module->super_wasm_ref_t).I.obj_;
    if (pOVar2->kind_ == Module) {
      uVar3 = 0;
      do {
        if ((ulong)(((long)pOVar2[5].finalizer_._M_invoker -
                    (long)pOVar2[5].finalizer_.super__Function_base._M_manager) / 0x48) <= uVar3) {
          trap.obj_ = (Trap *)0x0;
          trap.store_ = (Store *)0x0;
          trap.root_index_ = 0;
          wabt::interp::Instance::Instantiate
                    (&instance,&store->I,(Ref)(pOVar2->self_).index,&import_refs,&trap);
          pTVar1 = trap.obj_;
          this = (wasm_trap_t *)operator_new(0x18);
          if (pTVar1 == (Trap *)0x0) {
            local_60.obj_ = instance.obj_;
            local_60.store_ = instance.store_;
            if (instance.store_ == (Store *)0x0) {
              local_60.root_index_ = 0;
            }
            else {
              local_60.root_index_ =
                   wabt::interp::Store::CopyRoot(instance.store_,instance.root_index_);
            }
            ptr = &local_60;
            wasm_instance_t::wasm_instance_t((wasm_instance_t *)this,ptr);
          }
          else {
            local_48.obj_ = (Instance *)pTVar1;
            local_48.store_ = trap.store_;
            if (trap.store_ == (Store *)0x0) {
              local_48.root_index_ = 0;
            }
            else {
              local_48.root_index_ = wabt::interp::Store::CopyRoot(trap.store_,trap.root_index_);
            }
            ptr = &local_48;
            wasm_trap_t::wasm_trap_t(this,(RefPtr<wabt::interp::Trap> *)ptr);
            *trap_out = this;
            this = (wasm_trap_t *)0x0;
          }
          if (ptr->obj_ != (Instance *)0x0) {
            wabt::interp::Store::DeleteRoot(ptr->store_,ptr->root_index_);
            ptr->obj_ = (Instance *)0x0;
            ptr->store_ = (Store *)0x0;
            ptr->root_index_ = 0;
          }
          if (instance.obj_ != (Instance *)0x0) {
            wabt::interp::Store::DeleteRoot(instance.store_,instance.root_index_);
            instance.obj_ = (Instance *)0x0;
            instance.store_ = (Store *)0x0;
            instance.root_index_ = 0;
          }
          if (trap.obj_ != (Trap *)0x0) {
            wabt::interp::Store::DeleteRoot(trap.store_,trap.root_index_);
            trap.obj_ = (Trap *)0x0;
            trap.store_ = (Store *)0x0;
            trap.root_index_ = 0;
          }
          if (import_refs.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(import_refs.
                            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)import_refs.
                                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)import_refs.
                                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          return (wasm_instance_t *)this;
        }
        trap.obj_ = (Trap *)(((imports[uVar3]->super_wasm_ref_t).I.obj_)->self_).index;
        if (import_refs.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            import_refs.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
          _M_realloc_insert<wabt::interp::Ref>
                    (&import_refs,
                     (iterator)
                     import_refs.
                     super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(Ref *)&trap);
        }
        else {
          (import_refs.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
           _M_impl.super__Vector_impl_data._M_finish)->index = (size_t)trap.obj_;
          import_refs.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               import_refs.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        uVar3 = uVar3 + 1;
        pOVar2 = (module->super_wasm_ref_t).I.obj_;
      } while (pOVar2->kind_ == Module);
    }
    __assert_fail("isa<Derived>(base)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/cast.h"
                  ,0x4e,
                  "Derived *wabt::cast(Base *) [Derived = wabt::interp::Module, Base = wabt::interp::Object]"
                 );
  }
  __assert_fail("store",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/interp/interp-wasm-c-api.cc"
                ,0x2df,
                "wasm_instance_t *wasm_instance_new(wasm_store_t *, const wasm_module_t *, const wasm_extern_t *const *, wasm_trap_t **)"
               );
}

Assistant:

own wasm_instance_t* wasm_instance_new(wasm_store_t* store,
                                       const wasm_module_t* module,
                                       const wasm_extern_t* const imports[],
                                       own wasm_trap_t** trap_out) {
  TRACE("%p %p", store, module);
  assert(module);
  assert(store);

  RefVec import_refs;
  for (size_t i = 0; i < module->As<Module>()->import_types().size(); i++) {
    import_refs.push_back(imports[i]->I->self());
  }

  Trap::Ptr trap;
  auto instance =
      Instance::Instantiate(store->I, module->I->self(), import_refs, &trap);
  if (trap) {
    *trap_out = new wasm_trap_t{trap};
    return nullptr;
  }

  return new wasm_instance_t{instance};
}